

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

bool __thiscall
helics::Federate::checkValidFilterType
          (Federate *this,bool useTypes,FilterTypes opType,string *operation)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  bool bVar1;
  undefined8 uVar2;
  InvalidParameter *this_00;
  undefined8 in_RCX;
  int in_EDX;
  byte in_SIL;
  Federate *in_RDI;
  undefined1 in_stack_00000070 [16];
  string_view in_stack_00000080;
  string emessage;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  undefined1 *puVar3;
  char *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int level;
  size_t in_stack_fffffffffffffe48;
  char *pcVar4;
  char *in_stack_fffffffffffffe50;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  __sv_type local_188;
  __sv_type local_178;
  __sv_type local_158;
  char *local_148;
  undefined8 local_140;
  char local_138 [80];
  undefined8 local_e8;
  int local_e0;
  byte local_d9;
  bool local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  char *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *local_90;
  undefined8 uStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 *local_60;
  char *local_58;
  undefined8 uStack_50;
  undefined8 local_40;
  char *local_38;
  undefined8 uStack_30;
  char *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8;
  
  level = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_d9 = in_SIL & 1;
  local_e8 = in_RCX;
  local_e0 = in_EDX;
  if ((local_d9 == 0) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08),
     ((bVar1 ^ 0xffU) & 1) == 0)) {
    if (((local_d9 & 1) == 0) && (local_e0 == 7)) {
      if ((in_RDI->strictConfigChecking & 1U) != 0) {
        local_148 = "unrecognized filter operation:{}";
        local_140 = 0x20;
        pcVar4 = local_138;
        local_38 = "unrecognized filter operation:{}";
        uStack_30 = 0x20;
        local_40 = local_e8;
        local_58 = "unrecognized filter operation:{}";
        uStack_50 = 0x20;
        puVar3 = local_78;
        local_28 = pcVar4;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_18 = &local_68;
        local_68 = 0xd;
        local_20 = puVar3;
        local_60 = puVar3;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe10);
        message_03._M_str = in_stack_fffffffffffffe50;
        message_03._M_len = in_stack_fffffffffffffe48;
        logMessage(in_RDI,level,message_03);
        this_00 = (InvalidParameter *)__cxa_allocate_exception(0x28);
        local_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffe10);
        message_00._M_str = pcVar4;
        message_00._M_len = (size_t)puVar3;
        InvalidParameter::InvalidParameter(this_00,message_00);
        __cxa_throw(this_00,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
      pcVar4 = "unrecognized filter operation:{}";
      pcVar5 = (char *)0x20;
      local_80 = &local_1a8;
      local_90 = "unrecognized filter operation:{}";
      uStack_88 = 0x20;
      local_98 = local_e8;
      local_a8 = "unrecognized filter operation:{}";
      uStack_a0 = 0x20;
      this_01 = &local_c8;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffffe20,local_80);
      local_8 = &local_c8.field_2;
      local_c8.field_2._M_allocated_capacity = 0xd;
      local_10 = this_01;
      local_c8.field_2._8_8_ = this_01;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
      local_188 = std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
      message_04._M_str = pcVar5;
      message_04._M_len = (size_t)pcVar4;
      logMessage(in_RDI,level,message_04);
      std::__cxx11::string::~string(this_01);
      local_c9 = false;
    }
    else {
      local_c9 = true;
    }
  }
  else {
    if ((in_RDI->strictConfigChecking & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      message_01._M_str = in_stack_fffffffffffffe50;
      message_01._M_len = in_stack_fffffffffffffe48;
      logMessage(in_RDI,level,message_01);
      uVar2 = __cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      message._M_str = in_stack_fffffffffffffe30;
      message._M_len = in_stack_fffffffffffffe28;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffe20,message);
      __cxa_throw(uVar2,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
    message_02._M_str = in_stack_fffffffffffffe50;
    message_02._M_len = in_stack_fffffffffffffe48;
    logMessage(in_RDI,level,message_02);
    local_c9 = false;
  }
  return local_c9;
}

Assistant:

bool Federate::checkValidFilterType(bool useTypes,
                                    FilterTypes opType,
                                    const std::string& operation) const
{
    if ((useTypes) && (operation != "custom")) {
        if (strictConfigChecking) {
            logMessage(HELICS_LOG_LEVEL_ERROR,
                       "input and output types may only be specified for custom filters");
            throw(InvalidParameter(
                "input and output types may only be specified for custom filters"));
        }
        logMessage(HELICS_LOG_LEVEL_WARNING,
                   "input and output types may only be specified for custom filters");
        return false;
    }
    if (!useTypes) {
        if (opType == FilterTypes::UNRECOGNIZED) {
            if (strictConfigChecking) {
                const std::string emessage =
                    fmt::format("unrecognized filter operation:{}", operation);
                logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                throw(InvalidParameter(emessage));
            }
            logMessage(HELICS_LOG_LEVEL_WARNING,
                       fmt::format("unrecognized filter operation:{}", operation));
            return false;
        }
    }
    return true;
}